

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenAddGlobalImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName,BinaryenType globalType,bool mutable_)

{
  Global *pGVar1;
  pointer pGVar2;
  Name local_c0;
  Name local_b0;
  Type local_a0;
  Name local_98;
  Name local_88 [2];
  Name local_68;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_58;
  __single_object glob_1;
  Global *glob;
  bool mutable__local;
  BinaryenType globalType_local;
  char *externalBaseName_local;
  char *externalModuleName_local;
  char *internalName_local;
  BinaryenModuleRef module_local;
  
  wasm::Name::Name((Name *)&glob_1,internalName);
  pGVar1 = wasm::Module::getGlobalOrNull(module,(Name)_glob_1);
  if (pGVar1 == (Global *)0x0) {
    std::make_unique<wasm::Global>();
    wasm::Name::Name(&local_68,internalName);
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_58);
    wasm::Name::operator=((Name *)pGVar2,&local_68);
    wasm::Name::Name(local_88,externalModuleName);
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_58);
    wasm::Name::operator=(&(pGVar2->super_Importable).module,local_88);
    wasm::Name::Name(&local_98,externalBaseName);
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_58);
    wasm::Name::operator=(&(pGVar2->super_Importable).base,&local_98);
    wasm::Type::Type(&local_a0,globalType);
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_58);
    (pGVar2->type).id = local_a0.id;
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_58);
    pGVar2->mutable_ = mutable_;
    wasm::Module::addGlobal(module,&local_58);
    std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_58);
  }
  else {
    wasm::Name::Name(&local_b0,externalModuleName);
    wasm::Name::operator=(&(pGVar1->super_Importable).module,&local_b0);
    wasm::Name::Name(&local_c0,externalBaseName);
    wasm::Name::operator=(&(pGVar1->super_Importable).base,&local_c0);
  }
  return;
}

Assistant:

void BinaryenAddGlobalImport(BinaryenModuleRef module,
                             const char* internalName,
                             const char* externalModuleName,
                             const char* externalBaseName,
                             BinaryenType globalType,
                             bool mutable_) {
  auto* glob = ((Module*)module)->getGlobalOrNull(internalName);
  if (glob == nullptr) {
    auto glob = std::make_unique<Global>();
    glob->name = internalName;
    glob->module = externalModuleName;
    glob->base = externalBaseName;
    glob->type = Type(globalType);
    glob->mutable_ = mutable_;
    ((Module*)module)->addGlobal(std::move(glob));
  } else {
    // already exists so just set module and base
    glob->module = externalModuleName;
    glob->base = externalBaseName;
  }
}